

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.h
# Opt level: O2

void propagate_carry_bwd(uchar *buf,uint32_t offs)

{
  uchar *puVar1;
  ulong uVar2;
  
  uVar2 = (ulong)offs;
  do {
    puVar1 = buf + uVar2;
    *puVar1 = *puVar1 + '\x01';
    uVar2 = (ulong)((int)uVar2 - 1);
  } while (*puVar1 == '\0');
  return;
}

Assistant:

static inline void propagate_carry_bwd(unsigned char *buf, uint32_t offs) {
  uint16_t sum, carry = 1;
  do {
    sum = (uint16_t)buf[offs] + 1;
    buf[offs--] = (unsigned char)sum;
    carry = sum >> 8;
  } while (carry);
}